

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err_test.cc
# Opt level: O1

void __thiscall ErrTest_PutMacro_Test::TestBody(ErrTest_PutMacro_Test *this)

{
  ulong uVar1;
  char *pcVar2;
  AssertionResult gtest_ar_2;
  int line;
  int expected_line;
  char *file;
  AssertionResult gtest_ar;
  AssertHelper local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e0;
  string local_1d8;
  uint local_1b4;
  int local_1b0 [2];
  char *local_1a8;
  undefined1 local_1a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190 [7];
  ios_base local_120 [264];
  
  local_1b0[1] = 0x84;
  ERR_put_error(0x22,0,0x44,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                ,0x84);
  uVar1 = ERR_get_error_line(&local_1a8,local_1b0);
  testing::AssertPred2Helper<bool(*)(char_const*,char_const*),char_const*,char[12]>
            ((testing *)local_1a0,"HasSuffix","file","\"err_test.cc\"",HasSuffix,&local_1a8,
             (char (*) [12])0x54e699);
  if (local_1a0[0] == (testing)0x0) {
    testing::Message::Message((Message *)&local_1d8);
    if (local_198 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_198->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
               ,0x8a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&local_1d8);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    if ((long *)CONCAT44(local_1d8._M_dataplus._M_p._4_4_,local_1d8._M_dataplus._M_p._0_4_) !=
        (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_1d8._M_dataplus._M_p._4_4_,
                                     local_1d8._M_dataplus._M_p._0_4_) + 8))();
    }
  }
  if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_198,local_198);
  }
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1a0,"expected_line","line",local_1b0 + 1,local_1b0);
  if (local_1a0[0] == (testing)0x0) {
    testing::Message::Message((Message *)&local_1d8);
    if (local_198 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_198->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
               ,0x8b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&local_1d8);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    if ((long *)CONCAT44(local_1d8._M_dataplus._M_p._4_4_,local_1d8._M_dataplus._M_p._0_4_) !=
        (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_1d8._M_dataplus._M_p._4_4_,
                                     local_1d8._M_dataplus._M_p._0_4_) + 8))();
    }
  }
  if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_198,local_198);
  }
  local_1b4 = (uint)(uVar1 >> 0x18) & 0xff;
  if (local_1b4 == 0x22) {
    testing::AssertionSuccess();
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1a0);
    std::ostream::operator<<(local_190,0x22);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
    std::ios_base::~ios_base(local_120);
    testing::PrintToString<int>((string *)local_1a0,(int *)&local_1b4);
    testing::internal::EqFailure
              ((internal *)&local_1e8,"ERR_LIB_USER","ERR_GET_LIB(error)",&local_1d8,
               (string *)local_1a0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_1a0._1_7_,local_1a0[0]) != local_190) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_1a0._1_7_,local_1a0[0]),
                      local_190[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1d8._M_dataplus._M_p._4_4_,local_1d8._M_dataplus._M_p._0_4_) !=
        &local_1d8.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_1d8._M_dataplus._M_p._4_4_,local_1d8._M_dataplus._M_p._0_4_),
                      local_1d8.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_1e8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_1a0);
    if (local_1e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_1e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
               ,0x8c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)local_1a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
    if ((long *)CONCAT71(local_1a0._1_7_,local_1a0[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_1a0._1_7_,local_1a0[0]) + 8))();
    }
  }
  if (local_1e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1e0,local_1e0);
  }
  local_1d8._M_dataplus._M_p._0_4_ = 0x44;
  local_1e8.data_._0_4_ = (uint)uVar1 & 0xfff;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1a0,"(4 | 64)","ERR_GET_REASON(error)",(int *)&local_1d8,
             (int *)&local_1e8);
  if (local_1a0[0] == (testing)0x0) {
    testing::Message::Message((Message *)&local_1d8);
    if (local_198 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_198->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
               ,0x8d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&local_1d8);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    if ((long *)CONCAT44(local_1d8._M_dataplus._M_p._4_4_,local_1d8._M_dataplus._M_p._0_4_) !=
        (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_1d8._M_dataplus._M_p._4_4_,
                                     local_1d8._M_dataplus._M_p._0_4_) + 8))();
    }
  }
  if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_198,local_198);
  }
  return;
}

Assistant:

TEST(ErrTest, PutMacro) {
  int expected_line = __LINE__ + 1;
  OPENSSL_PUT_ERROR(USER, ERR_R_INTERNAL_ERROR);

  int line;
  const char *file;
  uint32_t error = ERR_get_error_line(&file, &line);

  EXPECT_PRED2(HasSuffix, file, "err_test.cc");
  EXPECT_EQ(expected_line, line);
  EXPECT_EQ(ERR_LIB_USER, ERR_GET_LIB(error));
  EXPECT_EQ(ERR_R_INTERNAL_ERROR, ERR_GET_REASON(error));
}